

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelling.cpp
# Opt level: O0

void createVars(vec<IntVar_*> *x,int n,int min,int max,bool el)

{
  IntVar *pIVar1;
  IntVar **ppIVar2;
  int in_EDX;
  int in_ESI;
  vec<IntVar_*> *in_RDI;
  byte in_R8B;
  int i;
  undefined8 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint index;
  
  vec<IntVar_*>::growTo
            ((vec<IntVar_*> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             (uint)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  for (index = 0; (int)index < in_ESI; index = index + 1) {
    pIVar1 = newIntVar(in_ESI,in_EDX);
    ppIVar2 = vec<IntVar_*>::operator[](in_RDI,index);
    *ppIVar2 = pIVar1;
    if ((in_R8B & 1) != 0) {
      vec<IntVar_*>::operator[](in_RDI,index);
      IntVar::specialiseToEL((IntVar *)CONCAT44(in_ESI,in_EDX));
    }
  }
  return;
}

Assistant:

void createVars(vec<IntVar*>& x, int n, int min, int max, bool el) {
	assert(x.size() == 0);
	x.growTo(n);
	for (int i = 0; i < n; i++) {
		x[i] = newIntVar(min, max);
		if (el) {
			x[i]->specialiseToEL();
		}
	}
}